

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::MidiEventQueue::~MidiEventQueue(MidiEventQueue *this)

{
  MidiEvent *currentEvent;
  Bit32u i;
  MidiEventQueue *this_local;
  
  for (currentEvent._4_4_ = 0; currentEvent._4_4_ <= this->ringBufferMask;
      currentEvent._4_4_ = currentEvent._4_4_ + 1) {
    (*this->sysexDataStorage->_vptr_SysexDataStorage[4])
              (this->sysexDataStorage,this->ringBuffer[currentEvent._4_4_].sysexData,
               (ulong)this->ringBuffer[currentEvent._4_4_].field_1.sysexLength);
  }
  if (this->sysexDataStorage != (SysexDataStorage *)0x0) {
    (*this->sysexDataStorage->_vptr_SysexDataStorage[1])();
  }
  if (this->ringBuffer != (MidiEvent *)0x0) {
    operator_delete__(this->ringBuffer);
  }
  return;
}

Assistant:

MidiEventQueue::~MidiEventQueue() {
	for (Bit32u i = 0; i <= ringBufferMask; i++) {
		volatile MidiEvent &currentEvent = ringBuffer[i];
		sysexDataStorage.dispose(currentEvent.sysexData, currentEvent.sysexLength);
	}
	delete &sysexDataStorage;
	delete[] ringBuffer;
}